

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

void __thiscall
leveldb::anon_unknown_1::PosixRandomAccessFile::~PosixRandomAccessFile(PosixRandomAccessFile *this)

{
  RandomAccessFile *in_RDI;
  
  if (((ulong)in_RDI[1]._vptr_RandomAccessFile & 1) != 0) {
    close(*(int *)((long)&in_RDI[1]._vptr_RandomAccessFile + 4));
    Limiter::Release((Limiter *)in_RDI[2]._vptr_RandomAccessFile);
  }
  std::__cxx11::string::~string((string *)(in_RDI + 3));
  RandomAccessFile::~RandomAccessFile(in_RDI);
  return;
}

Assistant:

~PosixRandomAccessFile() override {
    if (has_permanent_fd_) {
      assert(fd_ != -1);
      ::close(fd_);
      fd_limiter_->Release();
    }
  }